

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalidModelUnsupportedLayersForBP(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  WeightParams *pWVar3;
  ostream *poVar4;
  Result local_e8;
  CategoricalCrossEntropyLossLayer *ceLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  PoolingLayerParams *params;
  NeuralNetworkLayer *l3;
  UnaryFunctionLayerParams *elem;
  NeuralNetworkLayer *l2;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *l1;
  NeuralNetwork *nn;
  ArrayFeatureType *type_out;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)out,ArrayFeatureType_ArrayDataType_FLOAT32);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  type_out = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)type_out,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)type_out);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)nn,ArrayFeatureType_ArrayDataType_FLOAT32);
  CoreML::Specification::Model::set_isupdatable((Model *)&topIn,true);
  CoreML::Specification::Model::set_specificationversion((Model *)&topIn,4);
  l1 = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  innerProductParams =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l1);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)innerProductParams,"inner_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)innerProductParams,"A")
  ;
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams,"ip");
  CoreML::Specification::NeuralNetworkLayer::set_isupdatable
            ((NeuralNetworkLayer *)innerProductParams,true);
  l2 = (NeuralNetworkLayer *)
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                 ((NeuralNetworkLayer *)innerProductParams);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels((InnerProductLayerParams *)l2,1)
  ;
  CoreML::Specification::InnerProductLayerParams::set_outputchannels
            ((InnerProductLayerParams *)l2,1);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_weights
                     ((InnerProductLayerParams *)l2);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_weights
                     ((InnerProductLayerParams *)l2);
  CoreML::Specification::WeightParams::set_isupdatable(pWVar3,true);
  CoreML::Specification::InnerProductLayerParams::set_hasbias((InnerProductLayerParams *)l2,true);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_bias
                     ((InnerProductLayerParams *)l2);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_bias
                     ((InnerProductLayerParams *)l2);
  CoreML::Specification::WeightParams::set_isupdatable(pWVar3,true);
  elem = (UnaryFunctionLayerParams *)
         CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l1);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)elem,"abs_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)elem,"ip");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)elem,"abs_out");
  l3 = (NeuralNetworkLayer *)
       CoreML::Specification::NeuralNetworkLayer::mutable_unary((NeuralNetworkLayer *)elem);
  CoreML::Specification::UnaryFunctionLayerParams::set_type
            ((UnaryFunctionLayerParams *)l3,UnaryFunctionLayerParams_Operation_ABS);
  params = (PoolingLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l1);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)params,"pooling_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"abs_out");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"B");
  updateParams = (NetworkUpdateParameters *)
                 CoreML::Specification::NeuralNetworkLayer::mutable_pooling
                           ((NeuralNetworkLayer *)params);
  CoreML::Specification::PoolingLayerParams::set_type
            ((PoolingLayerParams *)updateParams,PoolingLayerParams_PoolingType_AVERAGE);
  CoreML::Specification::PoolingLayerParams::set_globalpooling
            ((PoolingLayerParams *)updateParams,true);
  CoreML::Specification::PoolingLayerParams::mutable_valid((PoolingLayerParams *)updateParams);
  lossLayer = (LossLayer *)
              CoreML::Specification::NeuralNetwork::mutable_updateparams((NeuralNetwork *)l1);
  ceLossLayer = (CategoricalCrossEntropyLossLayer *)
                CoreML::Specification::NetworkUpdateParameters::add_losslayers
                          ((NetworkUpdateParameters *)lossLayer);
  CoreML::Specification::LossLayer::set_name((LossLayer *)ceLossLayer,"loss_layer");
  local_e8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer
                 ((LossLayer *)ceLossLayer);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input
            ((CategoricalCrossEntropyLossLayer *)local_e8.m_message._M_storage._M_storage,"B");
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target
            ((CategoricalCrossEntropyLossLayer *)local_e8.m_message._M_storage._M_storage,
             "label_target");
  CoreML::Model::validate(&local_e8,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_e8);
  if (m._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x168);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_e8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidModelUnsupportedLayersForBP() {

    /* checks if there are layers between updatable-marked layers and loss function that do not support back-propagation
     input ---> inner_product (U) ----> ABS (not supported for BP) ---> pooling --> output
     */


    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    shape->add_shape(1);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    m.set_isupdatable(true);
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto *nn = m.mutable_neuralnetwork();
    auto *l1 = nn->add_layers();
    l1->set_name("inner_layer");
    l1->add_input("A");
    l1->add_output("ip");
    l1->set_isupdatable(true);
    Specification::InnerProductLayerParams *innerProductParams = l1->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);
    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(true);

    auto *l2 = nn->add_layers();
    l2->set_name("abs_layer");
    l2->add_input("ip");
    l2->add_output("abs_out");
    auto *elem = l2->mutable_unary();
    elem->set_type(Specification::UnaryFunctionLayerParams::ABS);

    auto *l3 = nn->add_layers();
    l3->set_name("pooling_layer");
    l3->add_input("abs_out");
    l3->add_output("B");
    auto *params = l3->mutable_pooling();
    params->set_type(::Specification::PoolingLayerParams::AVERAGE);
    params->set_globalpooling(true);
    params->mutable_valid();

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("loss_layer");

    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("B");
    ceLossLayer->set_target("label_target");

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}